

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

char * __thiscall
cmNinjaNormalTargetGenerator::GetVisibleTypeName(cmNinjaNormalTargetGenerator *this)

{
  bool bVar1;
  TargetType TVar2;
  cmGeneratorTarget *pcVar3;
  cmNinjaNormalTargetGenerator *this_local;
  
  pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  TVar2 = cmGeneratorTarget::GetType(pcVar3);
  switch(TVar2) {
  case EXECUTABLE:
    this_local = (cmNinjaNormalTargetGenerator *)0xa45da9;
    break;
  case STATIC_LIBRARY:
    this_local = (cmNinjaNormalTargetGenerator *)0xa555e2;
    break;
  case SHARED_LIBRARY:
    this_local = (cmNinjaNormalTargetGenerator *)0xa45db5;
    break;
  case MODULE_LIBRARY:
    pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    bVar1 = cmGeneratorTarget::IsCFBundleOnApple(pcVar3);
    if (bVar1) {
      this_local = (cmNinjaNormalTargetGenerator *)anon_var_dwarf_45edbb;
    }
    else {
      this_local = (cmNinjaNormalTargetGenerator *)0xa41c01;
    }
    break;
  default:
    this_local = (cmNinjaNormalTargetGenerator *)0x0;
  }
  return (char *)this_local;
}

Assistant:

const char* cmNinjaNormalTargetGenerator::GetVisibleTypeName() const
{
  switch (this->GetGeneratorTarget()->GetType()) {
    case cmStateEnums::STATIC_LIBRARY:
      return "static library";
    case cmStateEnums::SHARED_LIBRARY:
      return "shared library";
    case cmStateEnums::MODULE_LIBRARY:
      if (this->GetGeneratorTarget()->IsCFBundleOnApple()) {
        return "CFBundle shared module";
      } else {
        return "shared module";
      }
    case cmStateEnums::EXECUTABLE:
      return "executable";
    default:
      return CM_NULLPTR;
  }
}